

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _d,int _c,
                  Allocator *_allocator)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t _elemsize;
  int *piVar6;
  int _w_00;
  long lVar7;
  long lVar8;
  ulong uVar9;
  Mat tmp;
  
  iVar1 = this->w;
  iVar2 = this->h;
  iVar3 = this->d;
  iVar4 = this->c;
  _w_00 = _d * _c * _h * _w;
  if (iVar3 * iVar4 * iVar2 * iVar1 == _w_00) {
    iVar5 = this->dims;
    if (iVar5 < 3) {
      lVar7 = (long)_h * (long)_w * (long)_d;
      _elemsize = this->elemsize;
      if (lVar7 - (_elemsize * lVar7 + 0xf & 0xfffffffffffffff0) / _elemsize != 0) {
        __return_storage_ptr__->cstep = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->d = 0;
        __return_storage_ptr__->c = 0;
        create(__return_storage_ptr__,_w,_h,_d,_c,_elemsize,this->elempack,_allocator);
        if (_c < 1) {
          return __return_storage_ptr__;
        }
        lVar8 = 0;
        uVar9 = 0;
        do {
          memcpy((void *)(__return_storage_ptr__->cstep * uVar9 * __return_storage_ptr__->elemsize +
                         (long)__return_storage_ptr__->data),
                 (void *)(lVar8 * this->elemsize + (long)this->data),this->elemsize * lVar7);
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + lVar7;
        } while ((uint)_c != uVar9);
        return __return_storage_ptr__;
      }
    }
    else if (iVar4 != _c) {
      reshape(&tmp,this,_w_00,_allocator);
      reshape(__return_storage_ptr__,&tmp,_w,_h,_d,_c,_allocator);
      if (tmp.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *tmp.refcount = *tmp.refcount + -1;
      UNLOCK();
      if (*tmp.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (tmp.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)tmp.allocator + 0x18))();
        return __return_storage_ptr__;
      }
      if (tmp.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      free(tmp.data);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->data = this->data;
    piVar6 = this->refcount;
    __return_storage_ptr__->refcount = piVar6;
    __return_storage_ptr__->elemsize = this->elemsize;
    __return_storage_ptr__->elempack = this->elempack;
    __return_storage_ptr__->allocator = this->allocator;
    __return_storage_ptr__->dims = iVar5;
    __return_storage_ptr__->w = iVar1;
    __return_storage_ptr__->h = iVar2;
    __return_storage_ptr__->d = iVar3;
    __return_storage_ptr__->c = iVar4;
    __return_storage_ptr__->cstep = this->cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    __return_storage_ptr__->dims = 4;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->d = _d;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep =
         ((long)_h * (long)_w * (long)_d * this->elemsize + 0xf & 0xfffffffffffffff0) /
         this->elemsize;
  }
  else {
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->d = 0;
    __return_storage_ptr__->c = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _d, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _d * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h * _d != alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _d, _c, elemsize, elempack, _allocator);

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * _d * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * _d * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _d * _c, _allocator);
        return tmp.reshape(_w, _h, _d, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 4;
    m.w = _w;
    m.h = _h;
    m.d = _d;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize;

    return m;
}